

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_dictMatchState_7_0
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint h;
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  U32 *pUVar6;
  BYTE *pBVar7;
  BYTE *mEnd;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint h_00;
  U32 UVar15;
  U32 UVar16;
  uint uVar17;
  U32 UVar18;
  BYTE *iStart;
  BYTE *pInLimit;
  BYTE *pBVar19;
  size_t sVar20;
  long lVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  ulong uVar24;
  bool bVar25;
  BYTE *local_580;
  BYTE *local_570;
  BYTE *local_4e8;
  BYTE *local_4c8;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 offset_3;
  U32 offset;
  BYTE *dictMatch;
  U32 dictMatchIndex;
  BYTE *repMatchEnd;
  size_t dictHashAndTag1;
  size_t hash1;
  BYTE *repMatch;
  BYTE *pBStack_420;
  U32 repIndex;
  BYTE *match;
  BYTE *nextStep;
  size_t kStepIncr;
  size_t step;
  U32 curr;
  U32 matchIndex;
  int dictTagsMatch;
  U32 dictMatchIndexAndTag;
  size_t dictHashAndTag0;
  size_t hash0;
  size_t mLength;
  size_t _pos;
  size_t _size;
  char *_ptr;
  size_t hashTableBytes;
  U32 endIndex;
  U32 maxDistance;
  U32 dictHBits;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  U32 dictStartIndex;
  U32 *dictHashTable;
  ZSTD_compressionParameters *dictCParams;
  ZSTD_matchState_t *dms;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  BYTE *pBStack_340;
  U32 prefixStartIndex;
  BYTE *anchor;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *istart;
  BYTE *base;
  U32 stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  size_t local_2c0;
  size_t local_2a8;
  size_t local_290;
  ulong local_278;
  size_t local_260;
  ulong local_248;
  size_t local_230;
  size_t mlBase_3;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_3;
  ptrdiff_t diff_3;
  
  pUVar3 = ms->hashTable;
  h = (ms->cParams).hashLog;
  uVar12 = (ms->cParams).targetLength + (uint)(((ms->cParams).targetLength != 0 ^ 0xffU) & 1);
  pBVar4 = (ms->window).base;
  anchor = (BYTE *)((long)src + (ulong)uVar12);
  uVar1 = (ms->window).dictLimit;
  iStart = pBVar4 + uVar1;
  pInLimit = (BYTE *)((long)src + srcSize);
  pBVar19 = pInLimit + -8;
  dms._4_4_ = *rep;
  dms._0_4_ = rep[1];
  pZVar5 = ms->dictMatchState;
  pUVar6 = pZVar5->hashTable;
  uVar2 = (pZVar5->window).dictLimit;
  pBVar7 = (pZVar5->window).base;
  mEnd = (pZVar5->window).nextSrc;
  iVar8 = (int)mEnd;
  uVar13 = uVar1 - (iVar8 - (int)pBVar7);
  iVar9 = ((int)src - (int)iStart) + iVar8;
  iVar10 = (int)(pBVar7 + uVar2);
  uVar14 = iVar9 - iVar10;
  h_00 = (pZVar5->cParams).hashLog + 8;
  iVar11 = (int)pBVar4;
  if ((uint)(1 << ((byte)(ms->cParams).windowLog & 0x1f)) <
      (((int)src - iVar11) + (int)srcSize) - uVar1) {
    __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x1ee,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (uVar1 < (uint)(iVar8 - (int)pBVar7)) {
    __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x1f5,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (ms->prefetchCDictTables != 0) {
    for (mLength = 0; mLength < (ulong)((1L << ((byte)(pZVar5->cParams).hashLog & 0x3f)) << 2);
        mLength = mLength + 0x40) {
    }
  }
  ip1 = (BYTE *)((long)src + (long)(int)(uint)(iVar9 == iVar10));
  if (uVar14 < dms._4_4_) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x201,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (uVar14 < (uint)dms) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x202,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  pBStack_340 = (BYTE *)src;
  if (uVar12 == 0) {
    __assert_fail("stepSize >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x205,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
LAB_00ccc376:
  if (pBVar19 < anchor) {
LAB_00cce90e:
    *rep = dms._4_4_;
    rep[1] = (uint)dms;
    return (long)pInLimit - (long)pBStack_340;
  }
  if (0x20 < h) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(0xccc459) {
  case 0:
    local_230 = ZSTD_hash4Ptr(ip1,h);
    break;
  case 1:
    local_230 = ZSTD_hash5Ptr(ip1,h);
    break;
  case 2:
    local_230 = ZSTD_hash6Ptr(ip1,h);
    break;
  case 3:
    local_230 = ZSTD_hash7Ptr(ip1,h);
    break;
  case 4:
    local_230 = ZSTD_hash8Ptr(ip1,h);
  }
  dictHashAndTag0 = local_230;
  if (0x20 < h_00) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(0xccc56a) {
  case 0:
    local_248 = ZSTD_hash4Ptr(ip1,h_00);
    break;
  case 1:
    local_248 = ZSTD_hash5Ptr(ip1,h_00);
    break;
  case 2:
    local_248 = ZSTD_hash6Ptr(ip1,h_00);
    break;
  case 3:
    local_248 = ZSTD_hash7Ptr(ip1,h_00);
    break;
  case 4:
    local_248 = ZSTD_hash8Ptr(ip1,h_00);
  }
  matchIndex = pUVar6[local_248 >> 8];
  curr = ZSTD_comparePackedTags((ulong)matchIndex,local_248);
  step._4_4_ = pUVar3[local_230];
  step._0_4_ = (int)ip1 - iVar11;
  kStepIncr = (size_t)uVar12;
  match = ip1 + 0x100;
  do {
    pBStack_420 = pBVar4 + step._4_4_;
    uVar14 = ((uint)step + 1) - dms._4_4_;
    if (uVar14 < uVar1) {
      local_4c8 = pBVar7 + (uVar14 - uVar13);
    }
    else {
      local_4c8 = pBVar4 + uVar14;
    }
    if (0x20 < h) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    switch(0xccc78a) {
    case 0:
      local_260 = ZSTD_hash4Ptr(anchor,h);
      break;
    case 1:
      local_260 = ZSTD_hash5Ptr(anchor,h);
      break;
    case 2:
      local_260 = ZSTD_hash6Ptr(anchor,h);
      break;
    case 3:
      local_260 = ZSTD_hash7Ptr(anchor,h);
      break;
    case 4:
      local_260 = ZSTD_hash8Ptr(anchor,h);
    }
    if (0x20 < h_00) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    switch(0xccc89b) {
    case 0:
      local_278 = ZSTD_hash4Ptr(anchor,h_00);
      break;
    case 1:
      local_278 = ZSTD_hash5Ptr(anchor,h_00);
      break;
    case 2:
      local_278 = ZSTD_hash6Ptr(anchor,h_00);
      break;
    case 3:
      local_278 = ZSTD_hash7Ptr(anchor,h_00);
      break;
    case 4:
      local_278 = ZSTD_hash8Ptr(anchor,h_00);
    }
    pUVar3[dictHashAndTag0] = (uint)step;
    if (2 < (uVar1 - 1) - uVar14) {
      UVar15 = MEM_read32(local_4c8);
      UVar16 = MEM_read32(ip1 + 1);
      if (UVar15 != UVar16) goto LAB_00cccf2f;
      local_4e8 = pInLimit;
      if (uVar14 < uVar1) {
        local_4e8 = mEnd;
      }
      sVar20 = ZSTD_count_2segments(ip1 + 5,local_4c8 + 4,pInLimit,local_4e8,iStart);
      hash0 = sVar20 + 4;
      ip1 = ip1 + 1;
      uVar24 = (long)ip1 - (long)pBStack_340;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar24) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pInLimit < pBStack_340 + uVar24) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pInLimit + -0x20 < pBStack_340 + uVar24) {
        ZSTD_safecopyLiterals(seqStore->lit,pBStack_340,pBStack_340 + uVar24,pInLimit + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,pBStack_340);
        if (0x10 < uVar24) {
          pBVar23 = seqStore->lit;
          pBVar22 = pBVar23 + 0x10;
          lVar21 = (long)pBVar22 - (long)(pBStack_340 + 0x10);
          if ((lVar21 < 0x10) && (-0x10 < lVar21)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(pBVar22,pBStack_340 + 0x10);
          if (0x10 < (long)(uVar24 - 0x10)) {
            oend = pBVar23 + 0x20;
            do {
              op = pBStack_340 + 0x20;
              ZSTD_copy16(oend,op);
              ZSTD_copy16(oend + 0x10,pBStack_340 + 0x30);
              oend = oend + 0x20;
              pBStack_340 = op;
            } while (oend < pBVar22 + (uVar24 - 0x10));
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar24;
      if (0xffff < uVar24) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)uVar24;
      seqStore->sequences->offBase = 1;
      if (hash0 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < sVar20 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->mlBase = (U16)(sVar20 + 1);
      seqStore->sequences = seqStore->sequences + 1;
      goto LAB_00ccddfb;
    }
LAB_00cccf2f:
    if (curr != 0) {
      uVar14 = matchIndex >> 8;
      _offset_3 = pBVar7 + uVar14;
      if (uVar2 < uVar14) {
        UVar15 = MEM_read32(_offset_3);
        UVar16 = MEM_read32(ip1);
        if ((UVar15 == UVar16) && (step._4_4_ <= uVar1)) {
          uVar14 = ((uint)step - uVar14) - uVar13;
          sVar20 = ZSTD_count_2segments(ip1 + 4,_offset_3 + 4,pInLimit,mEnd,iStart);
          hash0 = sVar20 + 4;
          while( true ) {
            bVar25 = false;
            if (pBStack_340 < ip1 && pBVar7 + uVar2 < _offset_3) {
              bVar25 = ip1[-1] == _offset_3[-1];
            }
            if (!bVar25) break;
            ip1 = ip1 + -1;
            _offset_3 = _offset_3 + -1;
            hash0 = hash0 + 1;
          }
          dms._0_4_ = dms._4_4_;
          uVar24 = (long)ip1 - (long)pBStack_340;
          if (uVar14 == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                          ,0x23b,
                          "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar24) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pInLimit < pBStack_340 + uVar24) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pInLimit + -0x20 < pBStack_340 + uVar24) {
            ZSTD_safecopyLiterals(seqStore->lit,pBStack_340,pBStack_340 + uVar24,pInLimit + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,pBStack_340);
            if (0x10 < uVar24) {
              pBVar23 = seqStore->lit;
              pBVar22 = pBVar23 + 0x10;
              lVar21 = (long)pBVar22 - (long)(pBStack_340 + 0x10);
              if ((lVar21 < 0x10) && (-0x10 < lVar21)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                              ,0xe9,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar22,pBStack_340 + 0x10);
              if (0x10 < (long)(uVar24 - 0x10)) {
                oend_1 = pBVar23 + 0x20;
                do {
                  op_1 = pBStack_340 + 0x20;
                  ZSTD_copy16(oend_1,op_1);
                  ZSTD_copy16(oend_1 + 0x10,pBStack_340 + 0x30);
                  oend_1 = oend_1 + 0x20;
                  pBStack_340 = op_1;
                } while (oend_1 < pBVar22 + (uVar24 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar24;
          seqStore->sequences->offBase = uVar14 + 3;
          if (hash0 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0xffff < hash0 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->mlBase = (U16)(hash0 - 3);
          seqStore->sequences = seqStore->sequences + 1;
          dms._4_4_ = uVar14;
          goto LAB_00ccddfb;
        }
      }
    }
    if (uVar1 < step._4_4_) {
      UVar15 = MEM_read32(pBStack_420);
      UVar16 = MEM_read32(ip1);
      if (UVar15 == UVar16) break;
    }
    matchIndex = pUVar6[local_278 >> 8];
    curr = ZSTD_comparePackedTags((ulong)matchIndex,local_278);
    step._4_4_ = pUVar3[local_260];
    if (match <= anchor) {
      kStepIncr = kStepIncr + 1;
      match = match + 0x100;
    }
    ip1 = anchor;
    if (pBVar19 < anchor + kStepIncr) goto LAB_00cce90e;
    step._0_4_ = (int)anchor - iVar11;
    dictHashAndTag0 = local_260;
    anchor = anchor + kStepIncr;
  } while( true );
  uVar14 = (int)ip1 - (int)pBStack_420;
  sVar20 = ZSTD_count(ip1 + 4,pBStack_420 + 4,pInLimit);
  hash0 = sVar20 + 4;
  while( true ) {
    bVar25 = false;
    if (pBStack_340 < ip1 && iStart < pBStack_420) {
      bVar25 = ip1[-1] == pBStack_420[-1];
    }
    if (!bVar25) break;
    ip1 = ip1 + -1;
    pBStack_420 = pBStack_420 + -1;
    hash0 = hash0 + 1;
  }
  dms._0_4_ = dms._4_4_;
  uVar24 = (long)ip1 - (long)pBStack_340;
  if (uVar14 == 0) {
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x24d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar24) {
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a0,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit < pBStack_340 + uVar24) {
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a1,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (pInLimit + -0x20 < pBStack_340 + uVar24) {
    ZSTD_safecopyLiterals(seqStore->lit,pBStack_340,pBStack_340 + uVar24,pInLimit + -0x20);
  }
  else {
    ZSTD_copy16(seqStore->lit,pBStack_340);
    if (0x10 < uVar24) {
      pBVar23 = seqStore->lit;
      pBVar22 = pBVar23 + 0x10;
      lVar21 = (long)pBVar22 - (long)(pBStack_340 + 0x10);
      if ((lVar21 < 0x10) && (-0x10 < lVar21)) {
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                      ,0xe9,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      ZSTD_copy16(pBVar22,pBStack_340 + 0x10);
      if (0x10 < (long)(uVar24 - 0x10)) {
        oend_2 = pBVar23 + 0x20;
        do {
          op_2 = pBStack_340 + 0x20;
          ZSTD_copy16(oend_2,op_2);
          ZSTD_copy16(oend_2 + 0x10,pBStack_340 + 0x30);
          oend_2 = oend_2 + 0x20;
          pBStack_340 = op_2;
        } while (oend_2 < pBVar22 + (uVar24 - 0x10));
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar24;
  if (0xffff < uVar24) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2b2,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
    ;
  }
  seqStore->sequences->litLength = (U16)uVar24;
  seqStore->sequences->offBase = uVar14 + 3;
  if (hash0 < 3) {
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,700,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0xffff < hash0 - 3) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2bf,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
    ;
  }
  seqStore->sequences->mlBase = (U16)(hash0 - 3);
  seqStore->sequences = seqStore->sequences + 1;
  dms._4_4_ = uVar14;
LAB_00ccddfb:
  if (hash0 == 0) {
    __assert_fail("mLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x263,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  ip1 = ip1 + hash0;
  if (ip1 <= pBVar19) {
    if (pBVar4 + (ulong)(uint)step + 2 <= src) {
      __assert_fail("base+curr+2 > istart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x269,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    pBVar23 = pBVar4 + (ulong)(uint)step + 2;
    if (0x20 < h) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    switch(0xccdf93) {
    case 0:
      local_290 = ZSTD_hash4Ptr(pBVar23,h);
      break;
    case 1:
      local_290 = ZSTD_hash5Ptr(pBVar23,h);
      break;
    case 2:
      local_290 = ZSTD_hash6Ptr(pBVar23,h);
      break;
    case 3:
      local_290 = ZSTD_hash7Ptr(pBVar23,h);
      break;
    case 4:
      local_290 = ZSTD_hash8Ptr(pBVar23,h);
    }
    pUVar3[local_290] = (uint)step + 2;
    pBVar23 = ip1 + -2;
    if (0x20 < h) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    switch(0xcce0da) {
    case 0:
      local_2a8 = ZSTD_hash4Ptr(pBVar23,h);
      break;
    case 1:
      local_2a8 = ZSTD_hash5Ptr(pBVar23,h);
      break;
    case 2:
      local_2a8 = ZSTD_hash6Ptr(pBVar23,h);
      break;
    case 3:
      local_2a8 = ZSTD_hash7Ptr(pBVar23,h);
      break;
    case 4:
      local_2a8 = ZSTD_hash8Ptr(pBVar23,h);
    }
    pUVar3[local_2a8] = ((int)ip1 + -2) - iVar11;
    for (; uVar14 = (uint)dms, ip1 <= pBVar19; ip1 = ip1 + sVar20 + 4) {
      UVar15 = (int)ip1 - iVar11;
      uVar17 = UVar15 - (uint)dms;
      if (uVar17 < uVar1) {
        local_570 = pBVar7 + ((ulong)uVar17 - (ulong)uVar13);
      }
      else {
        local_570 = pBVar4 + uVar17;
      }
      if ((uVar1 - 1) - uVar17 < 3) break;
      UVar16 = MEM_read32(local_570);
      UVar18 = MEM_read32(ip1);
      if (UVar16 != UVar18) break;
      local_580 = pInLimit;
      if (uVar17 < uVar1) {
        local_580 = mEnd;
      }
      sVar20 = ZSTD_count_2segments(ip1 + 4,local_570 + 4,pInLimit,local_580,iStart);
      dms._0_4_ = dms._4_4_;
      dms._4_4_ = uVar14;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pInLimit < ip1) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pInLimit + -0x20 < ip1) {
        ZSTD_safecopyLiterals(seqStore->lit,ip1,ip1,pInLimit + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,ip1);
      }
      seqStore->lit = seqStore->lit;
      seqStore->sequences->litLength = 0;
      seqStore->sequences->offBase = 1;
      if (sVar20 + 4 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < sVar20 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->mlBase = (U16)(sVar20 + 1);
      seqStore->sequences = seqStore->sequences + 1;
      if (0x20 < h) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(0xcce84a) {
      case 0:
        local_2c0 = ZSTD_hash4Ptr(ip1,h);
        break;
      case 1:
        local_2c0 = ZSTD_hash5Ptr(ip1,h);
        break;
      case 2:
        local_2c0 = ZSTD_hash6Ptr(ip1,h);
        break;
      case 3:
        local_2c0 = ZSTD_hash7Ptr(ip1,h);
        break;
      case 4:
        local_2c0 = ZSTD_hash8Ptr(ip1,h);
      }
      pUVar3[local_2c0] = UVar15;
    }
  }
  anchor = ip1 + uVar12;
  pBStack_340 = ip1;
  goto LAB_00ccc376;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}